

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xpath_derived_from(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,
                      lys_module *param_4,lyxp_set *set,int options)

{
  lyxp_set_type lVar1;
  hash_table *phVar2;
  lyd_node *plVar3;
  ushort uVar4;
  int iVar5;
  lyxp_set *plVar6;
  lys_node *plVar7;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  ly_ctx *plVar11;
  undefined *puVar12;
  ushort uVar13;
  ulong uVar14;
  ulong uVar15;
  int local_34;
  
  plVar6 = *args;
  lVar1 = plVar6->type;
  if ((options & 0x1cU) == 0) {
    if (lVar1 < LYXP_SET_SNODE_SET) {
      iVar5 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
      local_34 = -1;
      if (iVar5 == 0) {
        set_free_content(set);
        set->type = LYXP_SET_BOOLEAN;
        (set->val).bool = 0;
        plVar6 = *args;
        local_34 = 0;
        if ((plVar6->type != LYXP_SET_EMPTY) && (plVar6->used != 0)) {
          uVar13 = 0;
          do {
            plVar3 = (plVar6->val).nodes[uVar13].node;
            if (((plVar3->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
               (*(int *)&plVar3->schema[1].ref == 7)) {
              uVar14 = (ulong)*(byte *)((long)&plVar3->child->next + 7);
              if (uVar14 == 0) {
                uVar4 = 0;
                uVar15 = 0;
LAB_001804b9:
                if ((ushort)uVar15 < uVar4) {
                  return 0;
                }
              }
              else {
                phVar2 = plVar3->child->ht;
                pcVar9 = (args[1]->val).str;
                uVar15 = 0;
                do {
                  iVar5 = xpath_derived_from_ident_cmp
                                    (*(lys_ident **)(&phVar2->used + uVar15 * 2),pcVar9);
                  if (iVar5 == 0) {
                    set_free_content(set);
                    set->type = LYXP_SET_BOOLEAN;
                    (set->val).bool = 1;
                    uVar4 = (ushort)*(byte *)((long)&plVar3->child->next + 7);
                    goto LAB_001804b9;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar14 != uVar15);
              }
              plVar6 = *args;
            }
            uVar13 = uVar13 + 1;
            local_34 = 0;
          } while ((uint)uVar13 < plVar6->used);
        }
      }
    }
    else {
      if (lVar1 - LYXP_SET_SNODE_SET < 4) {
        puVar12 = (&PTR_anon_var_dwarf_76a4c_001ccd68)[lVar1 - LYXP_SET_SNODE_SET];
      }
      else {
        puVar12 = (undefined *)0x0;
      }
      ly_vlog(param_4->ctx,LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,puVar12,
              "derived-from(node-set, string)");
      local_34 = -1;
    }
  }
  else {
    if (lVar1 == LYXP_SET_SNODE_SET) {
      uVar8 = plVar6->used;
      do {
        uVar8 = uVar8 - 1;
        if ((plVar6->val).nodes[uVar8].pos == 1) {
          plVar3 = (plVar6->val).nodes[uVar8].node;
          if (plVar3 != (lyd_node *)0x0) {
            if ((*(LYS_NODE *)&plVar3->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
              plVar11 = param_4->ctx;
              plVar7 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar3->ht);
              pcVar9 = "Argument #1 of %s is a %s node \"%s\".";
            }
            else {
              iVar5 = warn_is_specific_type((lys_type *)&plVar3[1].ht,LY_TYPE_IDENT);
              local_34 = 0;
              if (iVar5 != 0) goto LAB_00180586;
              plVar11 = param_4->ctx;
              plVar7 = plVar3->schema;
              pcVar9 = "Argument #1 of %s is node \"%s\", not of type \"identityref\".";
            }
            local_34 = 1;
            ly_log(plVar11,LY_LLWRN,LY_SUCCESS,pcVar9,"xpath_derived_from",plVar7);
            goto LAB_00180586;
          }
          break;
        }
      } while (uVar8 != 0);
    }
    local_34 = 1;
    ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s not a node-set as expected.",
           "xpath_derived_from");
LAB_00180586:
    plVar6 = args[1];
    if (plVar6->type == LYXP_SET_SNODE_SET) {
      uVar8 = plVar6->used;
      do {
        uVar8 = uVar8 - 1;
        if ((plVar6->val).nodes[uVar8].pos == 1) {
          plVar3 = (plVar6->val).nodes[uVar8].node;
          if (plVar3 == (lyd_node *)0x0) break;
          if ((*(LYS_NODE *)&plVar3->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            plVar11 = param_4->ctx;
            plVar7 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar3->ht);
            pcVar9 = "Argument #2 of %s is a %s node \"%s\".";
          }
          else {
            iVar5 = warn_is_string_type((lys_type *)&plVar3[1].ht);
            if (iVar5 != 0) break;
            plVar11 = param_4->ctx;
            plVar7 = plVar3->schema;
            pcVar9 = "Argument #2 of %s is node \"%s\", not of string-type.";
          }
          local_34 = 1;
          ly_log(plVar11,LY_LLWRN,LY_SUCCESS,pcVar9,"xpath_derived_from",plVar7);
          break;
        }
      } while (uVar8 != 0);
    }
    uVar8 = set->used;
    if ((ulong)uVar8 != 0) {
      lVar10 = 0;
      do {
        if (*(int *)((long)&((set->val).nodes)->pos + lVar10) == 1) {
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar10) = 0;
        }
        lVar10 = lVar10 + 0x10;
      } while ((ulong)uVar8 << 4 != lVar10);
    }
  }
  return local_34;
}

Assistant:

static int
xpath_derived_from(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
                   struct lyxp_set *set, int options)
{
    uint16_t i, j;
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type != LYXP_SET_SNODE_SET) || !(sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s not a node-set as expected.", __func__);
            ret = EXIT_FAILURE;
        } else if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
            ret = EXIT_FAILURE;
        } else if (!warn_is_specific_type(&sleaf->type, LY_TYPE_IDENT)) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of type \"identityref\".", __func__, sleaf->name);
            ret = EXIT_FAILURE;
        }

        if ((args[1]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(local_mod->ctx, LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "derived-from(node-set, string)");
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    set_fill_boolean(set, 0);
    if (args[0]->type != LYXP_SET_EMPTY) {
        for (i = 0; i < args[0]->used; ++i) {
            leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[i].node;
            sleaf = (struct lys_node_leaf *)leaf->schema;
            if ((sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && (sleaf->type.base == LY_TYPE_IDENT)) {
                for (j = 0; j < leaf->value.ident->base_size; ++j) {
                    if (!xpath_derived_from_ident_cmp(leaf->value.ident->base[j], args[1]->val.str)) {
                        set_fill_boolean(set, 1);
                        break;
                    }
                }

                if (j < leaf->value.ident->base_size) {
                    break;
                }
            }
        }
    }

    return EXIT_SUCCESS;
}